

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# so_layer.cpp
# Opt level: O2

environment_t * __thiscall so_5::layer_t::so_environment(layer_t *this)

{
  exception_t *this_00;
  allocator local_39;
  string local_38;
  
  if (this->m_env != (environment_t *)0x0) {
    return this->m_env;
  }
  this_00 = (exception_t *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string
            ((string *)&local_38,"so_environment isn\'t bound to this layer",&local_39);
  exception_t::exception_t(this_00,&local_38,100);
  __cxa_throw(this_00,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

environment_t &
layer_t::so_environment()
{
	if( nullptr == m_env )
	{
		throw so_5::exception_t(
			"so_environment isn't bound to this layer",
			rc_layer_not_binded_to_so_env );
	}

	return *m_env;
}